

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# relaxng.c
# Opt level: O3

void xmlRelaxNGFreeValidCtxt(xmlRelaxNGValidCtxtPtr ctxt)

{
  xmlRelaxNGValidStatePtr pxVar1;
  xmlRegExecCtxtPtr *ppxVar2;
  int iVar3;
  xmlRegExecCtxtPtr pxVar4;
  uint uVar5;
  xmlRelaxNGStatesPtr *ppxVar6;
  xmlRegExecCtxtPtr exec;
  long lVar7;
  xmlRelaxNGStatesPtr pxVar8;
  
  if (ctxt == (xmlRelaxNGValidCtxtPtr)0x0) {
    return;
  }
  pxVar8 = ctxt->states;
  if (pxVar8 != (xmlRelaxNGStatesPtr)0x0) {
    (*xmlFree)(pxVar8->tabState);
    (*xmlFree)(pxVar8);
  }
  pxVar8 = ctxt->freeState;
  if (pxVar8 != (xmlRelaxNGStatesPtr)0x0) {
    iVar3 = pxVar8->nbState;
    if (0 < iVar3) {
      lVar7 = 0;
      do {
        pxVar1 = pxVar8->tabState[lVar7];
        if (pxVar1 != (xmlRelaxNGValidStatePtr)0x0) {
          if (pxVar1->attrs != (xmlAttrPtr *)0x0) {
            (*xmlFree)(pxVar1->attrs);
          }
          (*xmlFree)(pxVar1);
          pxVar8 = ctxt->freeState;
          iVar3 = pxVar8->nbState;
        }
        lVar7 = lVar7 + 1;
      } while (lVar7 < iVar3);
    }
    (*xmlFree)(pxVar8->tabState);
    (*xmlFree)(pxVar8);
  }
  ppxVar6 = ctxt->freeStates;
  if (ppxVar6 != (xmlRelaxNGStatesPtr *)0x0) {
    iVar3 = ctxt->freeStatesNr;
    if (0 < iVar3) {
      lVar7 = 0;
      do {
        pxVar8 = ctxt->freeStates[lVar7];
        if (pxVar8 != (xmlRelaxNGStatesPtr)0x0) {
          (*xmlFree)(pxVar8->tabState);
          (*xmlFree)(pxVar8);
          iVar3 = ctxt->freeStatesNr;
        }
        lVar7 = lVar7 + 1;
      } while (lVar7 < iVar3);
      ppxVar6 = ctxt->freeStates;
    }
    (*xmlFree)(ppxVar6);
  }
  if (ctxt->errTab != (xmlRelaxNGValidErrorPtr)0x0) {
    (*xmlFree)(ctxt->errTab);
  }
  ppxVar2 = ctxt->elemTab;
  if (ppxVar2 != (xmlRegExecCtxtPtr *)0x0) {
    if (0 < ctxt->elemNr) {
      uVar5 = ctxt->elemNr - 1;
      ctxt->elemNr = uVar5;
      exec = ppxVar2[uVar5];
      ppxVar2[uVar5] = (xmlRegExecCtxtPtr)0x0;
      if (uVar5 == 0) goto LAB_00175ae0;
      pxVar4 = ctxt->elemTab[(ulong)uVar5 - 1];
      while (ctxt->elem = pxVar4, exec != (xmlRegExecCtxtPtr)0x0) {
        xmlRegFreeExecCtxt(exec);
        if (ctxt->elemNr < 1) break;
        uVar5 = ctxt->elemNr - 1;
        ctxt->elemNr = uVar5;
        exec = ctxt->elemTab[uVar5];
        ctxt->elemTab[uVar5] = (xmlRegExecCtxtPtr)0x0;
        if (uVar5 == 0) {
LAB_00175ae0:
          pxVar4 = (xmlRegExecCtxtPtr)0x0;
        }
        else {
          pxVar4 = ctxt->elemTab[(ulong)uVar5 - 1];
        }
      }
    }
    (*xmlFree)(ctxt->elemTab);
  }
  (*xmlFree)(ctxt);
  return;
}

Assistant:

void
xmlRelaxNGFreeValidCtxt(xmlRelaxNGValidCtxtPtr ctxt)
{
    int k;

    if (ctxt == NULL)
        return;
    if (ctxt->states != NULL)
        xmlRelaxNGFreeStates(NULL, ctxt->states);
    if (ctxt->freeState != NULL) {
        for (k = 0; k < ctxt->freeState->nbState; k++) {
            xmlRelaxNGFreeValidState(NULL, ctxt->freeState->tabState[k]);
        }
        xmlRelaxNGFreeStates(NULL, ctxt->freeState);
    }
    if (ctxt->freeStates != NULL) {
        for (k = 0; k < ctxt->freeStatesNr; k++) {
            xmlRelaxNGFreeStates(NULL, ctxt->freeStates[k]);
        }
        xmlFree(ctxt->freeStates);
    }
    if (ctxt->errTab != NULL)
        xmlFree(ctxt->errTab);
    if (ctxt->elemTab != NULL) {
        xmlRegExecCtxtPtr exec;

        exec = xmlRelaxNGElemPop(ctxt);
        while (exec != NULL) {
            xmlRegFreeExecCtxt(exec);
            exec = xmlRelaxNGElemPop(ctxt);
        }
        xmlFree(ctxt->elemTab);
    }
    xmlFree(ctxt);
}